

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::Clog2Function::eval
          (Clog2Function *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  uint32_t uVar2;
  ConstantValue *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  Expression *in_RDI;
  SVInt ci;
  ConstantValue v;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  EvalContext *in_stack_ffffffffffffff50;
  bitwidth_t bits;
  Expression *this_01;
  SVInt *in_stack_ffffffffffffffa8;
  
  this_01 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_RDI,in_stack_ffffffffffffff50);
  bits = (bitwidth_t)((ulong)in_RDI >> 0x20);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xaf8ce1);
  if (bVar1) {
    this_00 = (ConstantValue *)slang::ConstantValue::integer((ConstantValue *)0xaf8d2b);
    SVInt::SVInt((SVInt *)this_00,
                 (SVInt *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    SVInt::flattenUnknowns((SVInt *)this_00);
    uVar2 = clog2(in_stack_ffffffffffffffa8);
    SVInt::SVInt((SVInt *)this_01,bits,(uint64_t)this_00,SUB41(uVar2 >> 0x18,0));
    slang::ConstantValue::ConstantValue(this_00,(SVInt *)CONCAT44(uVar2,in_stack_ffffffffffffff48));
    SVInt::~SVInt((SVInt *)this_01);
    SVInt::~SVInt((SVInt *)this_01);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff50,
               (nullptr_t)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xaf8dea);
  return (ConstantValue *)this_01;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        ConstantValue v = args[0]->eval(context);
        if (!v)
            return nullptr;

        auto ci = v.integer();
        ci.flattenUnknowns();
        return SVInt(32, clog2(ci), true);
    }